

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

int __thiscall Imf_3_4::DeepScanLineOutputFile::currentScanLine(DeepScanLineOutputFile *this)

{
  int iVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  iVar1 = in_RDI[1]._M_device[4].super___mutex_base._M_mutex.__data.__kind;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b0b55);
  return iVar1;
}

Assistant:

int
DeepScanLineOutputFile::currentScanLine () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    return _data->currentScanLine;
}